

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.hpp
# Opt level: O0

void __thiscall
pico_tree::
kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
::kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::median_max_side_t>
          (kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
           *this,space_type *space,
          splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
          splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
          splitter_rule_t<pico_tree::median_max_side_t> *rule)

{
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *in_RDI;
  splitter_rule_t<pico_tree::median_max_side_t> *in_stack_00000098;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *in_stack_000000a0;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_stack_000000a8;
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>,_3UL>
  *in_stack_000000b0;
  space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  in_stack_000000b8;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
  *in_stack_ffffffffffffffb0;
  space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  local_38 [7];
  
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (in_stack_ffffffffffffffb0,in_RDI);
  internal::
  space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
  space_wrapper(local_38,in_RDI);
  internal::
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>,3ul>
  ::operator()(in_stack_000000b0,in_stack_000000b8,in_stack_000000a8,in_stack_000000a0,
               in_stack_00000098);
  return;
}

Assistant:

kd_tree(
      space_type space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds = Bounds_{},
      splitter_rule_t<Rule_> const& rule = Rule_{})
      : space_(std::move(space)),
        metric_(),
        data_(
            internal::build_kd_tree<kd_tree_data_type, dim>()(
                space_wrapper_type(space_),
                stop_condition,
                start_bounds,
                rule)) {}